

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O2

float stbir__filter_cubic(float x,float s)

{
  float fVar1;
  float fVar2;
  
  fVar2 = ABS(x);
  if (fVar2 < 1.0) {
    return ((fVar2 * 3.0 + -6.0) * x * x + 4.0) / 6.0;
  }
  fVar1 = 0.0;
  if (fVar2 < 2.0) {
    fVar1 = (((6.0 - fVar2) * fVar2 + -12.0) * fVar2 + 8.0) / 6.0;
  }
  return fVar1;
}

Assistant:

static float stbir__filter_cubic(float x, float s)
{
    STBIR__UNUSED_PARAM(s);

    x = (float)fabs(x);

    if (x < 1.0f)
        return (4 + x*x*(3*x - 6))/6;
    else if (x < 2.0f)
        return (8 + x*(-12 + x*(6 - x)))/6;

    return (0.0f);
}